

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

bool __thiscall
spvtools::val::ValidationState_t::ContainsLimitedUseIntOrFloatType
          (ValidationState_t *this,uint32_t id)

{
  bool bVar1;
  uint32_t id_local;
  ValidationState_t *this_local;
  
  bVar1 = HasCapability(this,CapabilityInt16);
  if ((((!bVar1) && (bVar1 = ContainsSizedIntOrFloatType(this,id,OpTypeInt,0x10), bVar1)) ||
      ((bVar1 = HasCapability(this,CapabilityInt8), !bVar1 &&
       (bVar1 = ContainsSizedIntOrFloatType(this,id,OpTypeInt,8), bVar1)))) ||
     ((bVar1 = HasCapability(this,CapabilityFloat16), !bVar1 &&
      (bVar1 = ContainsSizedIntOrFloatType(this,id,OpTypeFloat,0x10), bVar1)))) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ValidationState_t::ContainsLimitedUseIntOrFloatType(uint32_t id) const {
  if ((!HasCapability(spv::Capability::Int16) &&
       ContainsSizedIntOrFloatType(id, spv::Op::OpTypeInt, 16)) ||
      (!HasCapability(spv::Capability::Int8) &&
       ContainsSizedIntOrFloatType(id, spv::Op::OpTypeInt, 8)) ||
      (!HasCapability(spv::Capability::Float16) &&
       ContainsSizedIntOrFloatType(id, spv::Op::OpTypeFloat, 16))) {
    return true;
  }
  return false;
}